

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

string * __thiscall
Problem::getStringFromState_abi_cxx11_(string *__return_storage_ptr__,Problem *this,State *state)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  long lVar5;
  string *psVar6;
  char *pcVar7;
  double __val;
  vector<int,_std::allocator<int>_> local_188;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_90;
  int local_8c;
  int j;
  int curRegionsSize;
  int *curRegions;
  string local_78 [8];
  string currString;
  int curBidNumber;
  int i;
  vector<int,_std::allocator<int>_> bidNos;
  allocator local_22;
  byte local_21;
  State *local_20;
  State *state_local;
  Problem *this_local;
  string *stateString;
  
  local_21 = 0;
  local_20 = state;
  state_local = &this->state;
  this_local = (Problem *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  State::getBidNumbers((vector<int,_std::allocator<int>_> *)&curBidNumber,state);
  currString.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)currString.field_2._12_4_;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&curBidNumber);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&curBidNumber,
                        (long)(int)currString.field_2._12_4_);
    currString.field_2._8_4_ = *pvVar3;
    if (0 < (int)currString.field_2._8_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"[",(allocator *)((long)&curRegions + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&curRegions + 7));
      pvVar4 = std::vector<node,_std::allocator<node>_>::operator[]
                         (this->problemData + (int)currString.field_2._12_4_,
                          (long)(int)currString.field_2._8_4_);
      _j = pvVar4->region;
      pvVar4 = std::vector<node,_std::allocator<node>_>::operator[]
                         (this->problemData + (int)currString.field_2._12_4_,
                          (long)(int)currString.field_2._8_4_);
      local_8c = pvVar4->norc;
      for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
        std::__cxx11::to_string(&local_d0,_j[local_90]);
        std::operator+(&local_b0,&local_d0," ");
        std::__cxx11::string::append(local_78);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      lVar5 = std::__cxx11::string::length();
      std::__cxx11::string::replace((ulong)local_78,lVar5 - 1,(char *)0x1);
      psVar6 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&local_f0,currString.field_2._12_4_);
      pcVar7 = (char *)std::__cxx11::string::append(psVar6);
      psVar6 = (string *)std::__cxx11::string::append(pcVar7);
      std::__cxx11::to_string(&local_150,currString.field_2._8_4_);
      std::operator+(&local_130," ",&local_150);
      std::operator+(&local_110,&local_130,": ");
      psVar6 = (string *)std::__cxx11::string::append(psVar6);
      pcVar7 = (char *)std::__cxx11::string::append(psVar6);
      std::__cxx11::string::append(pcVar7);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string(local_78);
    }
    currString.field_2._12_4_ = currString.field_2._12_4_ + 1;
  }
  psVar6 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  State::getBidNumbers(&local_188,state);
  __val = getStateCost(this,&local_188);
  std::__cxx11::to_string(&local_170,__val);
  std::__cxx11::string::append(psVar6);
  std::__cxx11::string::~string((string *)&local_170);
  std::vector<int,_std::allocator<int>_>::~vector(&local_188);
  local_21 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&curBidNumber);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Problem::getStringFromState(State state) {
    string stateString = "{";
    vector<int> bidNos = state.getBidNumbers();
    for (int i = 0; i < bidNos.size(); ++i) {
        int curBidNumber = bidNos[i];
        if(curBidNumber>0){
            string currString = "[";
            int *curRegions = this->problemData[i][curBidNumber].region;
            int curRegionsSize = this->problemData[i][curBidNumber].norc;
            for (int j = 0; j < curRegionsSize; j++) {
                currString.append(to_string(curRegions[j]) + " ");
            }
            currString.replace(currString.length()-1, 1, "]");
            stateString.append("(").append(to_string(i)).append(",").append(" "+to_string(curBidNumber)+": ").append(currString).append(")");
        }
    }
    stateString.append("}").append(to_string(getStateCost(state.getBidNumbers())));
    return stateString;
}